

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O3

int GetPressureFromThreadP33xx(P33X *pP33x,double *pPressure)

{
  int iVar1;
  CRITICAL_SECTION *__mutex;
  long lVar2;
  
  __mutex = P33xCS;
  lVar2 = 0;
  do {
    if ((P33X *)addrsP33x[lVar2] == pP33x) {
      pthread_mutex_lock((pthread_mutex_t *)__mutex);
      *pPressure = pressureP33x[lVar2];
      iVar1 = resP33x[lVar2];
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return iVar1;
    }
    lVar2 = lVar2 + 1;
    __mutex = __mutex + 1;
  } while (lVar2 != 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int GetPressureFromThreadP33xx(P33X* pP33x, double* pPressure)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsP33x[id] != pP33x)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	EnterCriticalSection(&P33xCS[id]);
	*pPressure = pressureP33x[id];
	res = resP33x[id];
	LeaveCriticalSection(&P33xCS[id]);

	return res;
}